

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_TestParamSet.c
# Opt level: O3

void fiat_id_GostR3410_2001_TestParamSet_sub(uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar3 = *arg1 - *arg2;
  uVar5 = (ulong)(*arg1 < *arg2);
  uVar6 = uVar5 + arg2[1];
  uVar2 = arg1[1] - uVar6;
  uVar6 = (ulong)(byte)-(-(arg1[1] < uVar6) - CARRY8(uVar5,arg2[1]));
  uVar8 = uVar6 + arg2[2];
  uVar7 = arg1[2] - uVar8;
  uVar5 = arg1[3];
  uVar6 = (ulong)(byte)-(-(arg1[2] < uVar8) - CARRY8(uVar6,arg2[2]));
  uVar9 = uVar6 + arg2[3];
  uVar1 = -(ulong)((bool)-(uVar5 < uVar9) != CARRY8(uVar6,arg2[3]));
  uVar4 = (ulong)((uint)uVar1 & 0x431);
  uVar6 = (ulong)CARRY8(uVar4,uVar3);
  uVar8 = (ulong)CARRY8(uVar2,uVar6);
  *out1 = uVar4 + uVar3;
  out1[1] = uVar2 + uVar6;
  out1[2] = uVar7 + uVar8;
  out1[3] = (uVar1 & 0x8000000000000000) + (uVar5 - uVar9) + (ulong)CARRY8(uVar7,uVar8);
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_TestParamSet_sub(uint64_t out1[4],
                                                    const uint64_t arg1[4],
                                                    const uint64_t arg2[4]) {
    uint64_t x1;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x2;
    uint64_t x3;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x4;
    uint64_t x5;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x6;
    uint64_t x7;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x8;
    uint64_t x9;
    uint64_t x10;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x11;
    uint64_t x12;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x13;
    uint64_t x14;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x15;
    uint64_t x16;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x17;
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x1, &x2, 0x0, (arg1[0]),
                                                       (arg2[0]));
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x3, &x4, x2, (arg1[1]),
                                                       (arg2[1]));
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x5, &x6, x4, (arg1[2]),
                                                       (arg2[2]));
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x7, &x8, x6, (arg1[3]),
                                                       (arg2[3]));
    fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(
        &x9, x8, 0x0, UINT64_C(0xffffffffffffffff));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x10, &x11, 0x0, x1,
                                                      (x9 & UINT16_C(0x431)));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x12, &x13, x11, x3, 0x0);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x14, &x15, x13, x5, 0x0);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(
        &x16, &x17, x15, x7, (x9 & UINT64_C(0x8000000000000000)));
    out1[0] = x10;
    out1[1] = x12;
    out1[2] = x14;
    out1[3] = x16;
}